

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

MSize var_lookup_uv(FuncState *fs,MSize vidx,ExpDesc *e)

{
  byte bVar1;
  uint uVar2;
  MSize local_34;
  uint local_2c;
  MSize n;
  MSize i;
  ExpDesc *e_local;
  MSize vidx_local;
  FuncState *fs_local;
  
  bVar1 = fs->nuv;
  uVar2 = (uint)bVar1;
  local_2c = 0;
  while( true ) {
    if (uVar2 <= local_2c) {
      if (fs->nuv < 0x78) {
        fs->uvmap[uVar2] = (VarIndex)vidx;
        local_34 = vidx;
        if (e->k != VLOCAL) {
          local_34 = (e->u).s.info + 0xff88;
        }
        fs->uvtmp[uVar2] = (VarIndex)local_34;
        fs->nuv = bVar1 + 1;
        return uVar2;
      }
      err_limit(fs,0x78,"upvalues");
    }
    if (fs->uvmap[local_2c] == vidx) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static MSize var_lookup_uv(FuncState *fs, MSize vidx, ExpDesc *e)
{
  MSize i, n = fs->nuv;
  for (i = 0; i < n; i++)
    if (fs->uvmap[i] == vidx)
      return i;  /* Already exists. */
  /* Otherwise create a new one. */
  checklimit(fs, fs->nuv, LJ_MAX_UPVAL, "upvalues");
  lj_assertFS(e->k == VLOCAL || e->k == VUPVAL, "bad expr type %d", e->k);
  fs->uvmap[n] = (uint16_t)vidx;
  fs->uvtmp[n] = (uint16_t)(e->k == VLOCAL ? vidx : LJ_MAX_VSTACK+e->u.s.info);
  fs->nuv = n+1;
  return n;
}